

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  uint uVar23;
  longlong lVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar46;
  short sVar47;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *piVar48;
  short sVar49;
  short sVar50;
  undefined8 extraout_RDX;
  int *array;
  undefined4 in_register_00000084;
  ulong uVar52;
  undefined4 in_register_0000008c;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  longlong extraout_XMM0_Qb_05;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i alVar53;
  __m128i alVar54;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i mask_06;
  int32_t s2Len_00;
  int16_t *piVar55;
  ushort local_bdc;
  uint local_bc0;
  uint local_bbc;
  int local_ba8;
  int local_ba4;
  int local_b90;
  int local_b8c;
  int local_b78;
  int local_b74;
  int local_b60;
  int local_b5c;
  int local_b48;
  int local_b44;
  int local_b30;
  int local_b2c;
  int local_b18;
  int local_b14;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  int local_ab0;
  int local_aac;
  longlong *plStack_aa8;
  int32_t k;
  int16_t *j_1;
  int16_t *i_1;
  int16_t *u;
  int16_t *t;
  int16_t *s;
  int16_t last_val;
  int16_t max_col;
  int16_t max_row;
  __m128i cond_all_col;
  __m128i cond_all_row;
  __m128i cond_last_val;
  __m128i cond_max_col;
  __m128i cond_max_row;
  __m128i cond_i;
  __m128i cond_j;
  __m128i vJltLimit;
  __m128i vJgtNegOne;
  __m128i vJeqLimit1;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIeqLimit1;
  __m128i vIltLimit;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vLastVal;
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int iStack_780;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *F_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_F_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  ulong uVar51;
  
  mask[1] = CONCAT44(in_register_0000008c,gap);
  uVar52 = CONCAT44(in_register_00000084,open);
  s2B = (int16_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse2_128_16","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_sse2_128_16","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_sse2_128_16","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_sse2_128_16","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse2_128_16","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse2_128_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_sse2_128_16","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_ab0 = _s1Len;
    if (matrix->type != 0) {
      local_ab0 = matrix->length;
    }
    _POS_LIMIT = 0;
    iStack_780 = 0;
    N._0_2_ = (short)open;
    sVar46 = (short)N;
    if (matrix->min <= -open) {
      sVar46 = -(short)matrix->min;
    }
    sVar46 = sVar46 + -0x7fff;
    sVar47 = ((ushort)matrix->max ^ 0x7fff) - 1;
    vNegInf[1] = CONCAT26(sVar46,CONCAT24(sVar46,CONCAT22(sVar46,sVar46)));
    vSaturationCheckMax[0] = CONCAT26(sVar46,CONCAT24(sVar46,CONCAT22(sVar46,sVar46)));
    vSaturationCheckMax[1] = CONCAT26(sVar47,CONCAT24(sVar47,CONCAT22(sVar47,sVar47)));
    vSaturationCheckMin[0] = CONCAT26(sVar47,CONCAT24(sVar47,CONCAT22(sVar47,sVar47)));
    lVar24 = CONCAT26(sVar46,CONCAT24(sVar46,CONCAT22(sVar46,sVar46)));
    uVar25 = CONCAT26(sVar46,CONCAT24(sVar46,CONCAT22(sVar46,sVar46)));
    uVar26 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    uVar27 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    PAD._0_2_ = (short)gap;
    uVar28 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    uVar29 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    if (s1_beg == 0) {
      sVar49 = (short)PAD * 8;
      local_ad8 = CONCAT26(sVar49,CONCAT24(sVar49,CONCAT22(sVar49,sVar49)));
      uStack_ad0 = CONCAT26(sVar49,CONCAT24(sVar49,CONCAT22(sVar49,sVar49)));
    }
    else {
      local_ad8 = 0;
      uStack_ad0 = 0;
    }
    vI[0]._0_6_ = 0x100020003;
    vJreset[1] = 0x4000500060007;
    vI[0]._6_2_ = 0;
    s2Len_PAD._0_2_ = (undefined2)local_ab0;
    auVar41._2_2_ = (undefined2)s2Len_PAD;
    auVar41._0_2_ = (undefined2)s2Len_PAD;
    auVar41._4_2_ = (undefined2)s2Len_PAD;
    auVar41._6_2_ = (undefined2)s2Len_PAD;
    vILimit[0] = CONCAT26((undefined2)s2Len_PAD,
                          CONCAT24((undefined2)s2Len_PAD,
                                   CONCAT22((undefined2)s2Len_PAD,(undefined2)s2Len_PAD)));
    auVar41._8_8_ = vILimit[0];
    auVar40._8_8_ = 0x1000100010001;
    auVar40._0_8_ = 0x1000100010001;
    psubsw(auVar41,auVar40);
    gap_local._0_2_ = (undefined2)s2Len;
    auVar39._2_2_ = (undefined2)gap_local;
    auVar39._0_2_ = (undefined2)gap_local;
    auVar39._4_2_ = (undefined2)gap_local;
    auVar39._6_2_ = (undefined2)gap_local;
    auVar39._10_2_ = (undefined2)gap_local;
    auVar39._8_2_ = (undefined2)gap_local;
    auVar39._12_2_ = (undefined2)gap_local;
    auVar39._14_2_ = (undefined2)gap_local;
    auVar38._8_8_ = 0x1000100010001;
    auVar38._0_8_ = 0x1000100010001;
    psubsw(auVar39,auVar38);
    if (s1_beg == 0) {
      sVar49 = -(short)N;
      mask[1] = CONCAT62((int6)((ulong)mask[1] >> 0x10),sVar49 - (short)PAD);
      sVar50 = sVar49 + (short)PAD * -2;
      uVar52 = CONCAT62((int6)(uVar52 >> 0x10),sVar50);
      local_af8 = CONCAT26(sVar49 - (short)(gap << 2),
                           CONCAT24(sVar49 + (short)PAD * -5,
                                    CONCAT22(sVar49 + (short)PAD * -6,
                                             ((short)PAD - (short)(gap << 3)) - (short)N)));
      uStack_af0 = CONCAT26(sVar49,CONCAT24(sVar49 - (short)PAD,
                                            CONCAT22(sVar50,sVar49 + (short)PAD * -3)));
    }
    else {
      local_af8 = 0;
      uStack_af0 = 0;
    }
    vIBoundary[0] = uStack_af0;
    vNH[1] = local_af8;
    vILimit[1] = lVar24;
    vEndJ[0] = uVar25;
    vEndJ[1] = lVar24;
    vEndI[0] = uVar25;
    vEndI[1] = lVar24;
    vLastVal[0] = uVar25;
    vLastVal[1] = lVar24;
    vMaxHCol[0] = uVar25;
    vMaxHCol[1] = lVar24;
    _s1_local = (char *)parasail_result_new_table1(local_ab0,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x8201002;
      uVar23 = 0;
      if (s1_beg != 0) {
        uVar23 = 8;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar23 | ((parasail_result_t *)_s1_local)->flag;
      uVar23 = 0;
      if (s1_end != 0) {
        uVar23 = 0x10;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar23 | ((parasail_result_t *)_s1_local)->flag;
      uVar23 = 0;
      if (s2_beg != 0) {
        uVar23 = 0x4000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar23 | ((parasail_result_t *)_s1_local)->flag;
      uVar23 = 0;
      if (s2_end != 0) {
        uVar23 = 0x8000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar23 | ((parasail_result_t *)_s1_local)->flag;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      alVar53[0] = (size_t)(s2Len + 0xe);
      array = (int *)0x0;
      ptr_01 = parasail_memalign_int16_t(0x10,alVar53[0]);
      piVar48 = ptr + 7;
      if (ptr == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          alVar53[0] = (size_t)(local_ab0 + 7);
          array = (int *)0x0;
          s2B = parasail_memalign_int16_t(0x10,alVar53[0]);
          if (s2B == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_ab0; end_query = end_query + 1) {
            s2B[end_query] = (int16_t)matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_ab0; end_query < local_ab0 + 7; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          piVar48[end_ref] = (int16_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -7; iVar7 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          piVar48[end_ref] = 0;
        }
        while (end_ref = iVar7, end_ref < s2Len + 7) {
          piVar48[end_ref] = 0;
          iVar7 = end_ref + 1;
        }
        if (s2_beg == 0) {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 7] = -((short)end_ref * (short)PAD) - (short)N;
            ptr_01[(long)end_ref + 7] = sVar46;
          }
        }
        else {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 7] = 0;
            ptr_01[(long)end_ref + 7] = sVar46;
          }
        }
        for (end_ref = -7; iVar7 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = sVar46;
          ptr_01[(long)end_ref + 7] = sVar46;
        }
        while (end_ref = iVar7, end_ref < s2Len + 7) {
          ptr_00[(long)end_ref + 7] = sVar46;
          ptr_01[(long)end_ref + 7] = sVar46;
          iVar7 = end_ref + 1;
        }
        ptr_00[6] = 0;
        for (end_query = 0; end_query < local_ab0; end_query = end_query + 8) {
          vNH[0] = uVar25;
          vWH[1] = lVar24;
          vWH[0] = uVar25;
          vE[1] = lVar24;
          vF[0] = uVar25;
          vJ[1] = lVar24;
          vJ[0]._0_6_ = 0xfffffffefffd;
          matrow0 = (int *)0xfffcfffbfffafff9;
          vJ[0]._6_2_ = 0;
          piVar15 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_b14 = (int)s2B[end_query];
          }
          else {
            if (end_query < local_ab0) {
              local_b18 = end_query;
            }
            else {
              local_b18 = local_ab0 + -1;
            }
            local_b14 = local_b18;
          }
          piVar16 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_b2c = (int)s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_ab0) {
              local_b30 = end_query + 1;
            }
            else {
              local_b30 = local_ab0 + -1;
            }
            local_b2c = local_b30;
          }
          piVar17 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_b44 = (int)s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_ab0) {
              local_b48 = end_query + 2;
            }
            else {
              local_b48 = local_ab0 + -1;
            }
            local_b44 = local_b48;
          }
          piVar18 = matrix->matrix;
          iVar10 = matrix->size;
          if (matrix->type == 0) {
            local_b5c = (int)s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_ab0) {
              local_b60 = end_query + 3;
            }
            else {
              local_b60 = local_ab0 + -1;
            }
            local_b5c = local_b60;
          }
          piVar19 = matrix->matrix;
          iVar11 = matrix->size;
          if (matrix->type == 0) {
            local_b74 = (int)s2B[end_query + 4];
          }
          else {
            if (end_query + 4 < local_ab0) {
              local_b78 = end_query + 4;
            }
            else {
              local_b78 = local_ab0 + -1;
            }
            local_b74 = local_b78;
          }
          piVar20 = matrix->matrix;
          iVar12 = matrix->size;
          if (matrix->type == 0) {
            local_b8c = (int)s2B[end_query + 5];
          }
          else {
            if (end_query + 5 < local_ab0) {
              local_b90 = end_query + 5;
            }
            else {
              local_b90 = local_ab0 + -1;
            }
            local_b8c = local_b90;
          }
          piVar21 = matrix->matrix;
          iVar13 = matrix->size;
          if (matrix->type == 0) {
            local_ba4 = (int)s2B[end_query + 6];
          }
          else {
            if (end_query + 6 < local_ab0) {
              local_ba8 = end_query + 6;
            }
            else {
              local_ba8 = local_ab0 + -1;
            }
            local_ba4 = local_ba8;
          }
          piVar22 = matrix->matrix;
          iVar14 = matrix->size;
          if (matrix->type == 0) {
            local_bbc = (uint)s2B[end_query + 7];
          }
          else {
            if (end_query + 7 < local_ab0) {
              local_bc0 = end_query + 7;
            }
            else {
              local_bc0 = local_ab0 - 1;
            }
            local_bbc = local_bc0;
          }
          uVar51 = (ulong)local_bbc;
          stack0xfffffffffffff6f8 = vWH._10_14_;
          vNH[0]._6_2_ = ptr_00[6];
          vE[1] = vE._10_8_;
          vWH[0] = uVar25 >> 0x10;
          if (s1_beg == 0) {
            local_bdc = -((short)end_query * (short)PAD) - (short)N;
          }
          else {
            local_bdc = 0;
          }
          vWH[0] = vWH[0] | (ulong)local_bdc << 0x30;
          ptr_00[6] = -(((short)end_query + 8) * (short)PAD) - (short)N;
          vF[1] = lVar24;
          vE[0] = uVar25;
          for (end_ref = 0; auVar39 = stack0xfffffffffffff6f8, auVar38 = stack0xfffffffffffff6c8,
              end_ref < s2Len + 7; end_ref = end_ref + 1) {
            stack0xfffffffffffff6f8 = vE._10_14_;
            vNH[0]._6_2_ = ptr_00[(long)end_ref + 7];
            auVar41 = stack0xfffffffffffff6f8;
            stack0xfffffffffffff6c8 = vJ._10_14_;
            vF[0]._6_2_ = ptr_01[(long)end_ref + 7];
            auVar40 = stack0xfffffffffffff6c8;
            vWH[1] = vE._10_8_;
            vNH[0] = auVar41._8_8_;
            auVar37._8_8_ = vNH[0];
            auVar37._0_8_ = vWH[1];
            auVar36._8_8_ = uVar27;
            auVar36._0_8_ = uVar26;
            psubsw(auVar37,auVar36);
            vJ[1] = auVar38._2_8_;
            vF[0] = auVar40._8_8_;
            auVar35._8_8_ = vF[0];
            auVar35._0_8_ = vJ[1];
            auVar34._8_8_ = uVar29;
            auVar34._0_8_ = uVar28;
            psubsw(auVar35,auVar34);
            auVar33._8_8_ = uVar27;
            auVar33._0_8_ = uVar26;
            psubsw(stack0xfffffffffffff6e8,auVar33);
            auVar32._8_8_ = vE[0];
            auVar32._0_8_ = vF[1];
            auVar31._8_8_ = uVar29;
            auVar31._0_8_ = uVar28;
            psubsw(auVar32,auVar31);
            uVar1 = (undefined2)piVar16[(long)(iVar8 * local_b2c) + (long)piVar48[end_ref + -1]];
            mask[1] = CONCAT62((int6)((ulong)mask[1] >> 0x10),uVar1);
            uVar2 = (undefined2)piVar17[(long)(iVar9 * local_b44) + (long)piVar48[end_ref + -2]];
            mask[0] = CONCAT62((int6)(uVar52 >> 0x10),uVar2);
            uVar3 = (undefined2)piVar18[(long)(iVar10 * local_b5c) + (long)piVar48[end_ref + -3]];
            alVar54[0] = CONCAT62((int6)((ulong)array >> 0x10),uVar3);
            uVar4 = (undefined2)piVar19[(long)(iVar11 * local_b74) + (long)piVar48[end_ref + -4]];
            alVar54[1] = CONCAT62((int6)(alVar53[0] >> 0x10),uVar4);
            uVar5 = (undefined2)piVar20[(long)(iVar12 * local_b8c) + (long)piVar48[end_ref + -5]];
            b[0]._2_6_ = (undefined6)(uVar51 >> 0x10);
            b[0]._0_2_ = uVar5;
            uVar6 = (undefined2)piVar21[(long)(iVar13 * local_ba4) + (long)piVar48[end_ref + -6]];
            b[1] = CONCAT62(piVar48[end_ref + -6] >> 0xf,uVar6);
            auVar44._2_2_ = uVar6;
            auVar44._0_2_ =
                 (short)piVar22[(long)(int)(iVar14 * local_bbc) + (long)piVar48[end_ref + -7]];
            auVar44._4_2_ = uVar5;
            auVar44._6_2_ = uVar4;
            auVar44._10_2_ = uVar2;
            auVar44._8_2_ = uVar3;
            auVar44._12_2_ = uVar1;
            auVar44._14_2_ = (short)piVar15[(long)(iVar7 * local_b14) + (long)piVar48[end_ref]];
            paddsw(auVar39,auVar44);
            piVar55 = piVar48;
            alVar53 = _mm_blendv_epi8_rpl(alVar54,b,mask);
            s2Len_00 = (int32_t)piVar55;
            b_00[0] = alVar53[1];
            vWH[0] = extraout_XMM0_Qb;
            vE[1] = extraout_XMM0_Qa;
            a[1] = alVar54[1];
            a[0] = alVar54[0];
            b_00[1] = b[1];
            mask_00[1] = mask[1];
            mask_00[0] = mask[0];
            alVar53 = _mm_blendv_epi8_rpl(a,b_00,mask_00);
            b_01[0] = alVar53[1];
            vF[0] = extraout_XMM0_Qb_00;
            vJ[1] = extraout_XMM0_Qa_00;
            auVar38 = stack0xfffffffffffff6c8;
            a_00[1] = alVar54[1];
            a_00[0] = alVar54[0];
            b_01[1] = b[1];
            mask_01[1] = mask[1];
            mask_01[0] = mask[0];
            _mm_blendv_epi8_rpl(a_00,b_01,mask_01);
            local_308 = (short)extraout_XMM0_Qa;
            sStack_306 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
            sStack_304 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
            sStack_302 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
            sStack_300 = (short)extraout_XMM0_Qb;
            sStack_2fe = (short)((ulong)extraout_XMM0_Qb >> 0x10);
            sStack_2fc = (short)((ulong)extraout_XMM0_Qb >> 0x20);
            sStack_2fa = (short)((ulong)extraout_XMM0_Qb >> 0x30);
            if (7 < end_ref) {
              local_1f8 = (short)vSaturationCheckMax[1];
              sStack_1f6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_1f4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_1f2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_1f0 = (short)vSaturationCheckMin[0];
              sStack_1ee = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_1ec = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_1ea = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1] =
                   CONCAT26((ushort)(sStack_302 < sStack_1f2) * sStack_302 |
                            (ushort)(sStack_302 >= sStack_1f2) * sStack_1f2,
                            CONCAT24((ushort)(sStack_304 < sStack_1f4) * sStack_304 |
                                     (ushort)(sStack_304 >= sStack_1f4) * sStack_1f4,
                                     CONCAT22((ushort)(sStack_306 < sStack_1f6) * sStack_306 |
                                              (ushort)(sStack_306 >= sStack_1f6) * sStack_1f6,
                                              (ushort)(local_308 < local_1f8) * local_308 |
                                              (ushort)(local_308 >= local_1f8) * local_1f8)));
              vSaturationCheckMin[0] =
                   CONCAT26((ushort)(sStack_2fa < sStack_1ea) * sStack_2fa |
                            (ushort)(sStack_2fa >= sStack_1ea) * sStack_1ea,
                            CONCAT24((ushort)(sStack_2fc < sStack_1ec) * sStack_2fc |
                                     (ushort)(sStack_2fc >= sStack_1ec) * sStack_1ec,
                                     CONCAT22((ushort)(sStack_2fe < sStack_1ee) * sStack_2fe |
                                              (ushort)(sStack_2fe >= sStack_1ee) * sStack_1ee,
                                              (ushort)(sStack_300 < sStack_1f0) * sStack_300 |
                                              (ushort)(sStack_300 >= sStack_1f0) * sStack_1f0)));
              local_2f8 = (short)vNegInf[1];
              sStack_2f6 = (short)((ulong)vNegInf[1] >> 0x10);
              sStack_2f4 = (short)((ulong)vNegInf[1] >> 0x20);
              sStack_2f2 = (short)((ulong)vNegInf[1] >> 0x30);
              sStack_2f0 = (short)vSaturationCheckMax[0];
              sStack_2ee = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_2ec = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_2ea = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              vNegInf[1] = CONCAT26((ushort)(sStack_2f2 < sStack_302) * sStack_302 |
                                    (ushort)(sStack_2f2 >= sStack_302) * sStack_2f2,
                                    CONCAT24((ushort)(sStack_2f4 < sStack_304) * sStack_304 |
                                             (ushort)(sStack_2f4 >= sStack_304) * sStack_2f4,
                                             CONCAT22((ushort)(sStack_2f6 < sStack_306) * sStack_306
                                                      | (ushort)(sStack_2f6 >= sStack_306) *
                                                        sStack_2f6,
                                                      (ushort)(local_2f8 < local_308) * local_308 |
                                                      (ushort)(local_2f8 >= local_308) * local_2f8))
                                   );
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)(sStack_2ea < sStack_2fa) * sStack_2fa |
                            (ushort)(sStack_2ea >= sStack_2fa) * sStack_2ea,
                            CONCAT24((ushort)(sStack_2ec < sStack_2fc) * sStack_2fc |
                                     (ushort)(sStack_2ec >= sStack_2fc) * sStack_2ec,
                                     CONCAT22((ushort)(sStack_2ee < sStack_2fe) * sStack_2fe |
                                              (ushort)(sStack_2ee >= sStack_2fe) * sStack_2ee,
                                              (ushort)(sStack_2f0 < sStack_300) * sStack_300 |
                                              (ushort)(sStack_2f0 >= sStack_300) * sStack_2f0)));
            }
            array = ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row;
            alVar53[0] = (size_t)(uint)end_query;
            uVar52 = (ulong)(uint)s2Len;
            alVar53[1]._0_4_ = local_ab0;
            alVar53[1]._4_4_ = 0;
            arr_store_si128(array,alVar53,end_ref,s2Len,(int32_t)mask[1],s2Len_00);
            b_02[0]._2_6_ = (undefined6)((ulong)extraout_RDX >> 0x10);
            ptr_00[(long)(end_ref + -7) + 7] = local_308;
            vJ[1]._0_2_ = (int16_t)extraout_XMM0_Qa_00;
            b_02[0]._0_2_ = (int16_t)vJ[1];
            b_02[1] = (long)(end_ref + -7);
            ptr_01[b_02[1] + 7] = (int16_t)vJ[1];
            a_01[1] = alVar53[0];
            a_01[0] = (longlong)array;
            mask_02[1] = mask[1];
            mask_02[0] = uVar52;
            alVar54 = _mm_blendv_epi8_rpl(a_01,b_02,mask_02);
            b_03[0] = alVar54[1];
            a_02[1] = alVar53[0];
            a_02[0] = (longlong)array;
            b_03[1] = b_02[1];
            mask_03[1] = mask[1];
            mask_03[0] = uVar52;
            vMaxHCol[1] = extraout_XMM0_Qa_02;
            alVar54 = _mm_blendv_epi8_rpl(a_02,b_03,mask_03);
            b_04[0] = alVar54[1];
            a_03[1] = alVar53[0];
            a_03[0] = (longlong)array;
            b_04[1] = b_02[1];
            mask_04[1] = mask[1];
            mask_04[0] = uVar52;
            vLastVal[1] = extraout_XMM0_Qa_03;
            vMaxHCol[0] = extraout_XMM0_Qb_02;
            alVar54 = _mm_blendv_epi8_rpl(a_03,b_04,mask_04);
            b_05[0] = alVar54[1];
            a_04[1] = alVar53[0];
            a_04[0] = (longlong)array;
            b_05[1] = b_02[1];
            mask_05[1] = mask[1];
            mask_05[0] = uVar52;
            vEndI[1] = extraout_XMM0_Qa_04;
            vLastVal[0] = extraout_XMM0_Qb_03;
            alVar54 = _mm_blendv_epi8_rpl(a_04,b_05,mask_05);
            b_06[0] = alVar54[1];
            a_05[1] = alVar53[0];
            a_05[0] = (longlong)array;
            b_06[1] = b_02[1];
            mask_06[1] = mask[1];
            mask_06[0] = uVar52;
            vEndJ[1] = extraout_XMM0_Qa_05;
            vEndI[0] = extraout_XMM0_Qb_04;
            alVar54 = _mm_blendv_epi8_rpl(a_05,b_06,mask_06);
            uVar51 = alVar54[1];
            auVar43._8_8_ = 0x1000100010001;
            auVar43._0_8_ = 0x1000100010001;
            _matrow0 = paddsw(_matrow0,auVar43);
            unique0x10003664 = auVar38;
            vF[1] = extraout_XMM0_Qa_01;
            vE[0] = extraout_XMM0_Qb_01;
            unique0x100036a4 = auVar41;
            vILimit[1] = extraout_XMM0_Qa_06;
            vEndJ[0] = extraout_XMM0_Qb_05;
          }
          auVar42._8_8_ = 0x8000800080008;
          auVar42._0_8_ = 0x8000800080008;
          register0x00001200 = paddsw(stack0xfffffffffffff7b8,auVar42);
          auVar30._8_8_ = uStack_ad0;
          auVar30._0_8_ = local_ad8;
          register0x00001200 = psubsw(stack0xfffffffffffff708,auVar30);
        }
        t = (int16_t *)(vMaxHCol + 1);
        u = (int16_t *)(vLastVal + 1);
        i_1 = (int16_t *)(vEndI + 1);
        j_1 = (int16_t *)(vEndJ + 1);
        plStack_aa8 = vILimit + 1;
        s._2_2_ = sVar46;
        s._4_2_ = sVar46;
        s._6_2_ = sVar46;
        for (local_aac = 0; local_aac < 8; local_aac = local_aac + 1) {
          if ((s._4_2_ < *u) || ((*u == s._4_2_ && (*j_1 < _POS_LIMIT)))) {
            s._4_2_ = *u;
            _POS_LIMIT = (int)*j_1;
          }
          if (s._6_2_ < *t) {
            s._6_2_ = *t;
            iStack_780 = (int)(short)*plStack_aa8;
          }
          if (s._2_2_ < *i_1) {
            s._2_2_ = *i_1;
          }
          t = t + 1;
          u = u + 1;
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_aa8 = (longlong *)((long)plStack_aa8 + 2);
        }
        if ((s1_end == 0) || (s2_end == 0)) {
          if (s1_end == 0) {
            if (s2_end == 0) {
              vNegLimit[1]._2_2_ = s._2_2_;
              iStack_780 = s2Len + -1;
            }
            else {
              vNegLimit[1]._2_2_ = s._6_2_;
            }
            _POS_LIMIT = local_ab0 + -1;
          }
          else {
            vNegLimit[1]._2_2_ = s._4_2_;
            iStack_780 = s2Len + -1;
          }
        }
        else if ((s._6_2_ < s._4_2_) || ((s._4_2_ == s._6_2_ && (iStack_780 == s2Len + -1)))) {
          vNegLimit[1]._2_2_ = s._4_2_;
          iStack_780 = s2Len + -1;
        }
        else {
          vNegLimit[1]._2_2_ = s._6_2_;
          _POS_LIMIT = local_ab0 + -1;
        }
        local_1a8 = (short)vSaturationCheckMax[1];
        sStack_1a6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_1a4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_1a2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_1a0 = (short)vSaturationCheckMin[0];
        sStack_19e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_19c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_19a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_178 = (short)vNegInf[1];
        sStack_176 = (short)((ulong)vNegInf[1] >> 0x10);
        sStack_174 = (short)((ulong)vNegInf[1] >> 0x20);
        sStack_172 = (short)((ulong)vNegInf[1] >> 0x30);
        sStack_170 = (short)vSaturationCheckMax[0];
        sStack_16e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_16c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_16a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar52 = CONCAT26(-(ushort)(sStack_19a < sVar46),
                          CONCAT24(-(ushort)(sStack_19c < sVar46),
                                   CONCAT22(-(ushort)(sStack_19e < sVar46),
                                            -(ushort)(sStack_1a0 < sVar46)))) |
                 CONCAT26(-(ushort)(sVar47 < sStack_16a),
                          CONCAT24(-(ushort)(sVar47 < sStack_16c),
                                   CONCAT22(-(ushort)(sVar47 < sStack_16e),
                                            -(ushort)(sVar47 < sStack_170))));
        auVar45._8_8_ = uVar52;
        auVar45._0_8_ =
             CONCAT26(-(ushort)(sStack_1a2 < sVar46),
                      CONCAT24(-(ushort)(sStack_1a4 < sVar46),
                               CONCAT22(-(ushort)(sStack_1a6 < sVar46),-(ushort)(local_1a8 < sVar46)
                                       ))) |
             CONCAT26(-(ushort)(sVar47 < sStack_172),
                      CONCAT24(-(ushort)(sVar47 < sStack_174),
                               CONCAT22(-(ushort)(sVar47 < sStack_176),-(ushort)(sVar47 < local_178)
                                       )));
        if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar45 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar45 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar52 >> 7 & 1) != 0) || (uVar52 >> 0xf & 1) != 0) || (uVar52 >> 0x17 & 1) != 0)
               || (uVar52 >> 0x1f & 1) != 0) || (uVar52 >> 0x27 & 1) != 0) ||
             (uVar52 >> 0x2f & 1) != 0) || (uVar52 >> 0x37 & 1) != 0) || (long)uVar52 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          vNegLimit[1]._2_2_ = 0;
          _POS_LIMIT = 0;
          iStack_780 = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)vNegLimit[1]._2_2_;
        ((parasail_result_t *)_s1_local)->end_query = _POS_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = iStack_780;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}